

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O0

void __thiscall DPlat::PlayPlatSound(DPlat *this,char *sound)

{
  sector_t_conflict *sec;
  bool bVar1;
  FName local_1c;
  char *local_18;
  char *sound_local;
  DPlat *this_local;
  
  if ((((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector)->Flags & 0x40) == 0) {
    local_18 = sound;
    sound_local = (char *)this;
    if (((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector)->seqType < 0) {
      bVar1 = FName::operator!=(&(((this->super_DMovingFloor).super_DMover.super_DSectorEffect.
                                  m_Sector)->SeqName).super_FName,NAME_None);
      if (bVar1) {
        sec = (this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector;
        FName::FName(&local_1c,
                     &(((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector)->
                      SeqName).super_FName);
        SN_StartSequence((sector_t *)sec,1,&local_1c,0);
      }
      else {
        SN_StartSequence((sector_t *)
                         (this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector,1,
                         local_18,0);
      }
    }
    else {
      SN_StartSequence((sector_t *)
                       (this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector,1,
                       (int)((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector)->
                            seqType,SEQ_PLATFORM,0,false);
    }
  }
  return;
}

Assistant:

void DPlat::PlayPlatSound (const char *sound)
{
	if (m_Sector->Flags & SECF_SILENTMOVE) return;

	if (m_Sector->seqType >= 0)
	{
		SN_StartSequence (m_Sector, CHAN_FLOOR, m_Sector->seqType, SEQ_PLATFORM, 0);
	}
	else if (m_Sector->SeqName != NAME_None)
	{
		SN_StartSequence (m_Sector, CHAN_FLOOR, m_Sector->SeqName, 0);
	}
	else
	{
		SN_StartSequence (m_Sector, CHAN_FLOOR, sound, 0);
	}
}